

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvahammer.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__ptr;
  size_t sStack_50;
  int cnum;
  uint32_t a;
  uint32_t b;
  
  iVar1 = nva_init();
  if (iVar1 == 0) {
    cnum = 0;
    do {
      while( true ) {
        iVar1 = getopt(argc,argv,"c:");
        if (iVar1 != 99) break;
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar1 != -1);
    if (cnum < nva_cardsnum) {
      if (_optind < argc) {
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[_optind],"%x",&a);
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&b);
          do {
            *(uint32_t *)((long)nva_cards[cnum]->bar0 + (ulong)a) = b;
          } while( true );
        }
        __ptr = "No value specified.\n";
        sStack_50 = 0x14;
      }
      else {
        __ptr = "No address specified.\n";
        sStack_50 = 0x16;
      }
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_50 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_50 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_50 = 0x12;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	uint32_t a, b;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	if (optind + 1 >= argc) {
		fprintf (stderr, "No value specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	sscanf (argv[optind + 1], "%x", &b);
	while (1)
		nva_wr32(cnum, a, b);
	return 0;
}